

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O3

pair<void_*,_embree::BBox<embree::Vec3fa>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:81:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:86:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:91:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:107:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:122:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:127:9)>
::createLargeLeaf(pair<void_*,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr__,
                 BuilderT<std::pair<void_*,_embree::BBox<embree::Vec3fa>_>,_embree::FastAllocator::CachedAllocator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:81:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:86:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:91:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:107:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:122:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:127:9)>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  RTCBuildPrimitive *pRVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  anon_class_24_3_49846c50 *paVar4;
  anon_class_40_5_06182577 *paVar5;
  BuildPrim *pBVar6;
  PrimRef *pPVar7;
  RTCBuildPrimitive *pRVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  CachedAllocator alloc_00;
  float fVar11;
  float fVar12;
  uint uVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  RTCBounds *pRVar17;
  pair<void_*,_embree::BBox<embree::Vec3fa>_> *ppVar18;
  undefined8 *puVar19;
  ulong uVar20;
  range<unsigned_int> rVar21;
  range<unsigned_int> *current_00;
  ulong uVar22;
  range<unsigned_int> rVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  float *pfVar28;
  size_t i;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  range<unsigned_int> children [8];
  void *childptrs [8];
  RTCBounds *cbounds [8];
  pair<void_*,_embree::BBox<embree::Vec3fa>_> bounds [8];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  void *local_538;
  range<unsigned_int> local_530 [8];
  undefined1 local_4f0 [16];
  pair<void_*,_embree::BBox<embree::Vec3fa>_> local_4e0;
  RTCBounds *local_4a0 [8];
  RTCBuildPrimitive local_460;
  float local_440 [260];
  
  if ((this->super_Settings).maxDepth < depth) {
    puVar19 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_460._0_8_ = &local_460.upper_x;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"depth limit reached","");
    *puVar19 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar19 + 1) = 1;
    puVar19[2] = puVar19 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar19 + 2),local_460._0_8_,local_460._8_8_ + local_460._0_8_);
    __cxa_throw(puVar19,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar3 = current->_begin;
  uVar27 = (ulong)(current->_end - uVar3);
  uVar30 = (this->super_Settings).maxLeafSize;
  if (uVar30 < uVar27) {
    local_530[0] = *current;
    uVar27 = (this->super_Settings).branchingFactor;
    uVar20 = 2;
    if (2 < uVar27) {
      uVar20 = uVar27;
    }
    uVar27 = 1;
    rVar21 = *current;
    do {
      uVar22 = 0xffffffffffffffff;
      uVar29 = 0;
      uVar25 = 0;
      do {
        uVar26 = (ulong)(local_530[uVar29]._end - local_530[uVar29]._begin);
        uVar15 = uVar29;
        if (uVar26 <= uVar30 || uVar26 <= uVar25) {
          uVar26 = uVar25;
          uVar15 = uVar22;
        }
        uVar22 = uVar15;
        uVar25 = uVar26;
        uVar29 = uVar29 + 1;
      } while (uVar27 != uVar29);
      uVar25 = uVar27;
      if (uVar22 == 0xffffffffffffffff) break;
      uVar3 = local_530[uVar22]._begin;
      uVar24 = local_530[uVar22]._end + uVar3 >> 1;
      rVar23._end = local_530[uVar22]._end;
      rVar23._begin = uVar24;
      local_530[uVar22] = rVar21;
      (&local_538)[uVar27] = (void *)CONCAT44(uVar24,uVar3);
      local_530[uVar27] = rVar23;
      uVar27 = uVar27 + 1;
      rVar21 = rVar23;
      uVar25 = uVar20;
    } while (uVar27 != uVar20);
    uVar3 = (uint)uVar25;
    local_538 = (**this->createNode->createNode)
                          ((RTCThreadLocalAllocator)&alloc,uVar3,*this->createNode->userPtr);
    lVar16 = 0;
    do {
      *(undefined8 *)((long)&local_460.lower_x + lVar16) = 0;
      lVar16 = lVar16 + 0x30;
    } while (lVar16 != 0x180);
    current_00 = local_530;
    pfVar28 = local_440;
    uVar30 = uVar25;
    do {
      alloc_00.talloc0 = alloc.talloc0;
      alloc_00.alloc = alloc.alloc;
      alloc_00.talloc1 = alloc.talloc1;
      createLargeLeaf(&local_4e0,this,depth + 1,current_00,alloc_00);
      pvVar14 = local_538;
      *(void **)(pfVar28 + -8) = local_4e0.first;
      *(undefined8 *)(pfVar28 + -4) = local_4e0.second.lower.field_0._0_8_;
      *(undefined8 *)(pfVar28 + -2) = local_4e0.second.lower.field_0._8_8_;
      *(undefined8 *)pfVar28 = local_4e0.second.upper.field_0._0_8_;
      *(undefined8 *)(pfVar28 + 2) = local_4e0.second.upper.field_0._8_8_;
      pfVar28 = pfVar28 + 0xc;
      current_00 = current_00 + 1;
      uVar30 = uVar30 - 1;
    } while (uVar30 != 0);
    paVar4 = this->setBounds;
    pRVar17 = (RTCBounds *)&local_460;
    uVar30 = 0;
    auVar31 = _DAT_01f7aa00;
    local_4f0 = _DAT_01f7a9f0;
    do {
      pRVar17 = (RTCBounds *)((long)pRVar17 + 0x10);
      auVar32._0_4_ = pRVar17->lower_x;
      auVar32._4_4_ = pRVar17->lower_y;
      auVar32._8_4_ = pRVar17->lower_z;
      auVar32._12_4_ = pRVar17->align0;
      local_4f0 = minps(local_4f0,auVar32);
      auVar2._0_4_ = pRVar17->upper_x;
      auVar2._4_4_ = pRVar17->upper_y;
      auVar2._8_4_ = pRVar17->upper_z;
      auVar2._12_4_ = pRVar17->align1;
      auVar31 = maxps(auVar31,auVar2);
      (&local_4e0.first)[uVar30] = *(void **)&pRVar17[-1].upper_x;
      local_4a0[uVar30] = pRVar17;
      uVar30 = uVar30 + 1;
      pRVar17 = pRVar17 + 1;
    } while (uVar25 != uVar30);
    (**paVar4->setNodeBounds)(local_538,local_4a0,uVar3,*paVar4->userPtr);
    (**paVar4->setNodeChildren)(pvVar14,&local_4e0.first,uVar3,*paVar4->userPtr);
    __return_storage_ptr__->first = pvVar14;
    *(undefined8 *)&(__return_storage_ptr__->second).lower.field_0 = local_4f0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).lower.field_0 + 8) = local_4f0._8_8_;
    local_560 = auVar31._0_8_;
    uStack_558 = auVar31._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->second).upper.field_0 = local_560;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).upper.field_0 + 8) = uStack_558;
    ppVar18 = __return_storage_ptr__;
  }
  else {
    paVar5 = this->createLeaf;
    auVar31 = _DAT_01f7aa00;
    auVar32 = _DAT_01f7a9f0;
    if (current->_end != uVar3) {
      pBVar6 = paVar5->morton_src->items;
      pPVar7 = *paVar5->prims;
      pRVar8 = *paVar5->prims_i;
      lVar16 = 0;
      do {
        uVar24 = *(uint *)((long)&pBVar6[uVar3].field_0 + lVar16 + 4);
        auVar32 = minps(auVar32,(undefined1  [16])pPVar7[uVar24].lower.field_0);
        auVar31 = maxps(auVar31,(undefined1  [16])pPVar7[uVar24].upper.field_0);
        pRVar1 = pRVar8 + uVar24;
        uVar9 = *(undefined8 *)pRVar1;
        fVar12 = pRVar1->lower_z;
        uVar13 = pRVar1->geomID;
        pRVar1 = pRVar8 + uVar24;
        fVar11 = pRVar1->upper_y;
        uVar10 = *(undefined8 *)(&pRVar1->upper_x + 2);
        (local_440 + lVar16 + -4)[0] = pRVar1->upper_x;
        (local_440 + lVar16 + -4)[1] = fVar11;
        *(undefined8 *)(local_440 + lVar16 + -2) = uVar10;
        *(undefined8 *)(&local_460.lower_x + lVar16) = uVar9;
        (local_440 + lVar16 + -6)[0] = fVar12;
        (local_440 + lVar16 + -6)[1] = (float)uVar13;
        lVar16 = lVar16 + 8;
      } while ((uVar27 + (uVar27 == 0)) * 8 != lVar16);
    }
    ppVar18 = (pair<void_*,_embree::BBox<embree::Vec3fa>_> *)
              (**paVar5->createLeaf)
                        ((RTCThreadLocalAllocator)&alloc,&local_460,uVar27,*paVar5->userPtr);
    __return_storage_ptr__->first = ppVar18;
    local_550 = auVar32._0_8_;
    uStack_548 = auVar32._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->second).lower.field_0 = local_550;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).lower.field_0 + 8) = uStack_548;
    local_560 = auVar31._0_8_;
    uStack_558 = auVar31._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->second).upper.field_0 = local_560;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).upper.field_0 + 8) = uStack_558;
  }
  return ppVar18;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }